

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O1

void __thiscall
Js::JavascriptRegExp::JavascriptRegExp
          (JavascriptRegExp *this,JavascriptRegExp *instance,bool deepCopy)

{
  RegexPattern *pRVar1;
  void *pvVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  
  DynamicObject::DynamicObject(&this->super_DynamicObject,&instance->super_DynamicObject,deepCopy);
  (this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_015463a0;
  pRVar1 = (instance->pattern).ptr;
  Memory::Recycler::WBSetBit((char *)&this->pattern);
  (this->pattern).ptr = pRVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->pattern);
  pRVar1 = (instance->splitPattern).ptr;
  Memory::Recycler::WBSetBit((char *)&this->splitPattern);
  (this->splitPattern).ptr = pRVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->splitPattern);
  pvVar2 = (instance->lastIndexVar).ptr;
  Memory::Recycler::WBSetBit((char *)&this->lastIndexVar);
  (this->lastIndexVar).ptr = pvVar2;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->lastIndexVar);
  this->lastIndexOrFlag = instance->lastIndexOrFlag;
  bVar4 = ThreadContext::IsOnStack(instance);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpression.cpp"
                                ,0x42,"(ThreadContext::IsOnStack(instance))",
                                "ThreadContext::IsOnStack(instance)");
    if (!bVar4) goto LAB_00d13bc2;
    *puVar5 = 0;
  }
  bVar4 = ThreadContext::IsOnStack((instance->pattern).ptr);
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpression.cpp"
                                ,0x45,"(!ThreadContext::IsOnStack(instance->GetPattern()))",
                                "!ThreadContext::IsOnStack(instance->GetPattern())");
    if (!bVar4) goto LAB_00d13bc2;
    *puVar5 = 0;
  }
  bVar4 = ThreadContext::IsOnStack((instance->splitPattern).ptr);
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpression.cpp"
                                ,0x46,"(!ThreadContext::IsOnStack(instance->GetSplitPattern()))",
                                "!ThreadContext::IsOnStack(instance->GetSplitPattern())");
    if (!bVar4) goto LAB_00d13bc2;
    *puVar5 = 0;
  }
  bVar4 = ThreadContext::IsOnStack((instance->lastIndexVar).ptr);
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpression.cpp"
                                ,0x47,"(!ThreadContext::IsOnStack(instance->lastIndexVar))",
                                "!ThreadContext::IsOnStack(instance->lastIndexVar)");
    if (!bVar4) {
LAB_00d13bc2:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  return;
}

Assistant:

JavascriptRegExp::JavascriptRegExp(JavascriptRegExp * instance, bool deepCopy) :
        DynamicObject(instance, deepCopy),
        pattern(instance->GetPattern()),
        splitPattern(instance->GetSplitPattern()),
        lastIndexVar(instance->lastIndexVar),
        lastIndexOrFlag(instance->lastIndexOrFlag)
    {
        // For boxing stack instance
        Assert(ThreadContext::IsOnStack(instance));

        // These members should never be on the stack and thus never need to be deep copied
        Assert(!ThreadContext::IsOnStack(instance->GetPattern()));
        Assert(!ThreadContext::IsOnStack(instance->GetSplitPattern()));
        Assert(!ThreadContext::IsOnStack(instance->lastIndexVar));
    }